

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O0

uint64_t websocket_consume(void *buffer,uint64_t len,void *udata,uint8_t require_masking)

{
  void *msg;
  uint32_t mask;
  void *payload;
  uint8_t *pos;
  uint64_t reminder;
  websocket_packet_info_s info;
  uint8_t require_masking_local;
  void *udata_local;
  uint64_t len_local;
  void *buffer_local;
  
  _reminder = websocket_buffer_peek(buffer,len);
  if ((byte)info.packet_length == 0) {
    websocket_on_protocol_error(udata);
    buffer_local = (void *)0x0;
  }
  else {
    payload = buffer;
    pos = (uint8_t *)len;
    buffer_local = (void *)len;
    if ((byte)info.packet_length + reminder <= len) {
      while( true ) {
        if (pos < (uint8_t *)((byte)info.packet_length + reminder)) break;
        msg = (void *)((long)payload + (long)(int)(uint)(byte)info.packet_length);
        if (info.packet_length._1_1_ == '\0') {
          if ((require_masking != '\0') && (reminder != 0)) {
            websocket_on_protocol_error(udata);
          }
        }
        else {
          websocket_xmask(msg,reminder,*(uint32_t *)((long)msg + -4));
        }
        switch(*payload & 0xf) {
        case 0:
          websocket_on_unwrapped
                    (udata,msg,reminder,'\0',(char)((int)(uint)*payload >> 7),'\0',
                     (byte)((int)(uint)*payload >> 4) & 7);
          break;
        case 1:
          websocket_on_unwrapped
                    (udata,msg,reminder,'\x01',(char)((int)(uint)*payload >> 7),'\x01',
                     (byte)((int)(uint)*payload >> 4) & 7);
          break;
        case 2:
          websocket_on_unwrapped
                    (udata,msg,reminder,'\x01',(char)((int)(uint)*payload >> 7),'\0',
                     (byte)((int)(uint)*payload >> 4) & 7);
          break;
        default:
          websocket_on_protocol_error(udata);
          break;
        case 8:
          websocket_on_protocol_close(udata);
          break;
        case 9:
          websocket_on_protocol_ping(udata,msg,reminder);
          break;
        case 10:
          websocket_on_protocol_pong(udata,msg,reminder);
        }
        pos = pos + -((byte)info.packet_length + reminder);
        if (pos == (uint8_t *)0x0) {
          return 0;
        }
        payload = (void *)((byte)info.packet_length + reminder + (long)payload);
        _reminder = websocket_buffer_peek(payload,(uint64_t)pos);
      }
      memmove(buffer,(void *)((long)buffer + (len - (long)pos)),(size_t)pos);
      buffer_local = pos;
    }
  }
  return (uint64_t)buffer_local;
}

Assistant:

static uint64_t websocket_consume(void *buffer, uint64_t len, void *udata,
                                  uint8_t require_masking) {
  volatile struct websocket_packet_info_s info =
      websocket_buffer_peek(buffer, len);
  if (!info.head_length) {
#if DEBUG
    fprintf(stderr, "ERROR: WebSocket protocol error - malicious header.\n");
#endif
    websocket_on_protocol_error(udata);
    return 0;
  }
  if (info.head_length + info.packet_length > len)
    return len;
  uint64_t reminder = len;
  uint8_t *pos = (uint8_t *)buffer;
  while (info.head_length + info.packet_length <= reminder) {
    /* parse head */
    void *payload = (void *)(pos + info.head_length);
    /* unmask? */
    if (info.masked) {
      /* masked */
      uint32_t mask; // = ((uint32_t *)payload)[-1];
      ((uint8_t *)(&mask))[0] = ((uint8_t *)(payload))[-4];
      ((uint8_t *)(&mask))[1] = ((uint8_t *)(payload))[-3];
      ((uint8_t *)(&mask))[2] = ((uint8_t *)(payload))[-2];
      ((uint8_t *)(&mask))[3] = ((uint8_t *)(payload))[-1];
      websocket_xmask(payload, info.packet_length, mask);
    } else if (require_masking && info.packet_length) {
#if DEBUG
      fprintf(stderr, "ERROR: WebSocket protocol error - unmasked data.\n");
#endif
      websocket_on_protocol_error(udata);
    }
    /* call callback */
    switch (pos[0] & 15) {
    case 0:
      /* continuation frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 0,
                             ((pos[0] >> 7) & 1), 0, ((pos[0] >> 4) & 7));
      break;
    case 1:
      /* text frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 1,
                             ((pos[0] >> 7) & 1), 1, ((pos[0] >> 4) & 7));
      break;
    case 2:
      /* data frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 1,
                             ((pos[0] >> 7) & 1), 0, ((pos[0] >> 4) & 7));
      break;
    case 8:
      /* close frame */
      websocket_on_protocol_close(udata);
      break;
    case 9:
      /* ping frame */
      websocket_on_protocol_ping(udata, payload, info.packet_length);
      break;
    case 10:
      /* pong frame */
      websocket_on_protocol_pong(udata, payload, info.packet_length);
      break;
    default:
#if DEBUG
      fprintf(stderr, "ERROR: WebSocket protocol error - unknown opcode %u\n",
              (unsigned int)(pos[0] & 15));
#endif
      websocket_on_protocol_error(udata);
    }
    /* step forward */
    reminder = reminder - (info.head_length + info.packet_length);
    if (!reminder)
      return 0;
    pos += info.head_length + info.packet_length;
    info = websocket_buffer_peek(pos, reminder);
  }
  /* reset buffer state - support pipelining */
  memmove(buffer, (uint8_t *)buffer + len - reminder, reminder);
  return reminder;
}